

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int ffcalchist(long totalrows,long offset,long firstrow,long nrows,int ncols,iteratorCol *colpars,
              void *userPointer)

{
  int *piVar1;
  short *psVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  char cVar8;
  short sVar9;
  char *pcVar10;
  long lVar11;
  iteratorCol *piVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  double *colptr [5];
  int local_94;
  int local_90;
  long local_68 [6];
  long local_38;
  
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[4] = 0;
  if (firstrow == 1) {
    *(undefined8 *)((long)userPointer + 0xf0) = *(undefined8 *)((long)userPointer + 0xe8);
  }
  pcVar10 = *(char **)((long)userPointer + 0xf0);
  lVar14 = 0x18;
  lVar16 = 0;
  lVar17 = 0;
  local_94 = 0;
  local_38 = totalrows;
  do {
    uVar4 = *(uint *)((long)userPointer + lVar17 * 4 + 0x100);
    local_68[lVar17] = 0;
    bVar18 = false;
    iVar5 = local_90;
    if (-1 < (int)uVar4 && (lVar17 == 4 || lVar17 < *(int *)((long)userPointer + 0x10))) {
      iVar5 = *(int *)(*(long *)((long)userPointer + 0x120) + lVar14 * 4);
      if ((long)iVar5 < 1) {
        piVar12 = (iteratorCol *)((ulong)uVar4 * 0x110 + *(long *)((long)userPointer + 0x118));
      }
      else {
        piVar12 = (iteratorCol *)((ulong)uVar4 * 0x110 + *(long *)((long)userPointer + 0x118));
        local_94 = fits_parser_workfn(local_38,offset,firstrow,nrows,iVar5,piVar12,
                                      (void *)(*(long *)((long)userPointer + 0x128) + lVar16));
        piVar12 = piVar12 + (long)iVar5 + -1;
        bVar18 = true;
        iVar5 = local_94;
        if (local_94 != 0) goto LAB_00180948;
      }
      bVar18 = false;
      iVar5 = local_90;
      if (piVar12 != (iteratorCol *)0x0) {
        pvVar6 = fits_iter_get_array(piVar12);
        local_68[lVar17] = (long)pvVar6;
      }
    }
LAB_00180948:
    local_90 = iVar5;
    if (bVar18) {
      return local_90;
    }
    lVar17 = lVar17 + 1;
    lVar16 = lVar16 + 0x90;
    lVar14 = lVar14 + 0x3a;
  } while (lVar17 != 5);
  if (0 < nrows) {
    lVar16 = 1;
    lVar14 = 1;
    do {
      if (pcVar10 == (char *)0x0) {
        pcVar13 = (char *)0x0;
LAB_001809de:
        pcVar10 = pcVar13;
        if (0 < *(long *)((long)userPointer + 0xf8)) {
          lVar17 = local_68[4] + lVar16 * 8;
          lVar15 = 0;
          do {
            dVar20 = *(double *)(local_68[0] + lVar16 * 8 + lVar15 * 8);
            if (((dVar20 != -9.1191291391491e-36) || (NAN(dVar20))) &&
               ((local_68[4] == 0 ||
                ((dVar3 = *(double *)(lVar17 + lVar15 * 8), dVar3 != -9.1191291391491e-36 ||
                 (NAN(dVar3))))))) {
              dVar20 = (dVar20 - *(double *)((long)userPointer + 0x48)) /
                       *(double *)((long)userPointer + 0x88);
              lVar7 = (long)(dVar20 + 1.0);
              if ((0 < lVar7) &&
                 ((lVar7 <= *(long *)((long)userPointer + 0x28) &&
                  (dVar20 < *(double *)((long)userPointer + 0x68) ||
                   dVar20 == *(double *)((long)userPointer + 0x68))))) {
                iVar5 = *(int *)((long)userPointer + 0x10);
                if (1 < iVar5) {
                  dVar20 = *(double *)(local_68[1] + lVar16 * 8 + lVar15 * 8);
                  if ((((dVar20 == -9.1191291391491e-36) && (!NAN(dVar20))) ||
                      (dVar20 = (dVar20 - *(double *)((long)userPointer + 0x50)) /
                                *(double *)((long)userPointer + 0x90), dVar20 < 0.0)) ||
                     ((*(long *)((long)userPointer + 0x30) <= (long)dVar20 ||
                      (*(double *)((long)userPointer + 0x70) <= dVar20 &&
                       dVar20 != *(double *)((long)userPointer + 0x70))))) goto LAB_00180a20;
                  lVar7 = lVar7 + (long)dVar20 * *(long *)((long)userPointer + 0xb0);
                  if (iVar5 != 2) {
                    dVar20 = *(double *)(local_68[2] + lVar16 * 8 + lVar15 * 8);
                    if (((dVar20 == -9.1191291391491e-36) && (!NAN(dVar20))) ||
                       ((dVar20 = (dVar20 - *(double *)((long)userPointer + 0x58)) /
                                  *(double *)((long)userPointer + 0x98), dVar20 < 0.0 ||
                        ((*(long *)((long)userPointer + 0x38) <= (long)dVar20 ||
                         (*(double *)((long)userPointer + 0x78) <= dVar20 &&
                          dVar20 != *(double *)((long)userPointer + 0x78))))))) goto LAB_00180a20;
                    lVar7 = lVar7 + (long)dVar20 * *(long *)((long)userPointer + 0xb8);
                    if (3 < iVar5) {
                      dVar20 = *(double *)(local_68[3] + lVar16 * 8 + lVar15 * 8);
                      if ((((dVar20 == -9.1191291391491e-36) && (!NAN(dVar20))) ||
                          (dVar20 = (dVar20 - *(double *)((long)userPointer + 0x60)) /
                                    *(double *)((long)userPointer + 0xa0), dVar20 < 0.0)) ||
                         ((*(long *)((long)userPointer + 0x40) <= (long)dVar20 ||
                          (*(double *)((long)userPointer + 0x80) <= dVar20 &&
                           dVar20 != *(double *)((long)userPointer + 0x80))))) goto LAB_00180a20;
                      lVar7 = lVar7 + (long)dVar20 * *(long *)((long)userPointer + 0xc0);
                    }
                  }
                }
                dVar20 = *(double *)((long)userPointer + 0xe0);
                if ((dVar20 != -9.1191291391491e-36) || (NAN(dVar20))) {
                  iVar5 = *(int *)((long)userPointer + 0x24);
                  if (iVar5 < 0x1f) {
                    if (iVar5 == 0xb) {
LAB_00180c13:
                      cVar8 = (char)(int)dVar20;
LAB_00180c17:
                      *(char *)(*userPointer + lVar7) = *(char *)(*userPointer + lVar7) + cVar8;
                    }
                    else if (iVar5 == 0x15) {
LAB_00180bb1:
                      sVar9 = (short)(int)dVar20;
LAB_00180bb5:
                      psVar2 = (short *)(*userPointer + lVar7 * 2);
                      *psVar2 = *psVar2 + sVar9;
                    }
                  }
                  else {
                    if (iVar5 == 0x52) goto LAB_00180c29;
                    if (iVar5 == 0x2a) {
                      lVar11 = *userPointer;
                      dVar20 = dVar20 + (double)*(float *)(lVar11 + lVar7 * 4);
LAB_00180b93:
                      fVar19 = (float)dVar20;
LAB_00180bff:
                      *(float *)(lVar11 + lVar7 * 4) = fVar19;
                    }
                    else if (iVar5 == 0x1f) goto LAB_00180b39;
                  }
                }
                else if (*(int *)((long)userPointer + 0xd0) == 0) {
                  iVar5 = *(int *)((long)userPointer + 0x24);
                  if (iVar5 < 0x1f) {
                    if (iVar5 == 0xb) {
                      cVar8 = (char)(int)*(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180c17;
                    }
                    if (iVar5 == 0x15) {
                      sVar9 = (short)(int)*(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180bb5;
                    }
                  }
                  else {
                    if (iVar5 == 0x52) {
                      dVar20 = *(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180c29;
                    }
                    if (iVar5 == 0x2a) {
                      lVar11 = *userPointer;
                      dVar20 = (double)*(float *)(lVar11 + lVar7 * 4) +
                               *(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180b93;
                    }
                    if (iVar5 == 0x1f) {
                      dVar20 = *(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180b39;
                    }
                  }
                }
                else {
                  iVar5 = *(int *)((long)userPointer + 0x24);
                  if (iVar5 < 0x1f) {
                    if (iVar5 == 0xb) {
                      dVar20 = 1.0 / *(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180c13;
                    }
                    if (iVar5 == 0x15) {
                      dVar20 = 1.0 / *(double *)(lVar17 + lVar15 * 8);
                      goto LAB_00180bb1;
                    }
                  }
                  else if (iVar5 == 0x52) {
                    dVar20 = 1.0 / *(double *)(lVar17 + lVar15 * 8);
LAB_00180c29:
                    *(double *)(*userPointer + lVar7 * 8) =
                         dVar20 + *(double *)(*userPointer + lVar7 * 8);
                  }
                  else {
                    if (iVar5 == 0x2a) {
                      lVar11 = *userPointer;
                      fVar19 = (float)(1.0 / *(double *)(lVar17 + lVar15 * 8)) +
                               *(float *)(lVar11 + lVar7 * 4);
                      goto LAB_00180bff;
                    }
                    if (iVar5 == 0x1f) {
                      dVar20 = 1.0 / *(double *)(lVar17 + lVar15 * 8);
LAB_00180b39:
                      piVar1 = (int *)(*userPointer + lVar7 * 4);
                      *piVar1 = *piVar1 + (int)dVar20;
                    }
                  }
                }
              }
            }
LAB_00180a20:
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(long *)((long)userPointer + 0xf8));
          lVar16 = lVar16 + lVar15;
        }
      }
      else {
        pcVar13 = pcVar10 + 1;
        if (*pcVar10 != '\0') goto LAB_001809de;
        lVar16 = lVar16 + *(long *)((long)userPointer + 0xf8);
        pcVar10 = pcVar13;
      }
      bVar18 = lVar14 != nrows;
      lVar14 = lVar14 + 1;
    } while (bVar18);
  }
  *(char **)((long)userPointer + 0xf0) = pcVar10;
  return local_94;
}

Assistant:

int ffcalchist(long totalrows, long offset, long firstrow, long nrows,
             int ncols, iteratorCol *colpars, void *userPointer)
/*
   Interator work function that calculates values for the 2D histogram.
*/
{
    long ii, ipix, iaxisbin;
    double pix, axisbin;
    char *rowselect;
    histType *histData = (histType*)userPointer;
    double *colptr[MAXDIMS] = {0};
    int status = 0;
    long irow;

    if (firstrow == 1) {
      histData->rowselector_cur = histData->rowselector;
    }
    rowselect = histData->rowselector_cur;

    for (ii=0; ii<=4; ii++) {
      int startCol = histData->startCols[ii];
      iteratorCol *outcol = 0;
      /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
      colptr[ii] = 0;

      /* Do not process unspecified axes (but do process weight column) */
      if ( (ii >= histData->haxis && ii != 4) || histData->startCols[ii] < 0) continue;

      /* We have a parser for this, evaluate it */
      if (histData->parsers[ii].nCols > 0) {
	struct ParseStatusVariables *pv = &(histData->infos[ii].parseVariables);
	iteratorCol *colData = &(histData->iterCols[startCol]);
	int nCols = histData->parsers[ii].nCols;

	status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
				    nCols, colData, (void *) &(histData->infos[ii]));
	if (status) return status;
	/* Output column is last iterator column, which better be a TemporaryCol */
	outcol = &(colData[nCols-1]);

      } else {
	outcol = &(histData->iterCols[startCol]);
      }

      if (outcol) {
	/* Note that the 0th array element returned by the iterator is
	   actually the null value!  This is actually rather a big
	   undocumented "feature" of the iterator. However, "ii" below
	   starts at a value of 1 which skips over the null value */
	colptr[ii] = ((double *) fits_iter_get_array(outcol));
      }
    }

    /*  Main loop over rows */
    /* irow = row counter (1 .. nrows) */
    /* elem = counter of element (1 .. histData->repeat) for each row */
    /* ii = counts up from 1 (see note below) used to index colptr[]'s */

    /* Note that ii starts at 1 because position [0] in the 
       column data arrays is for the "null" value! */
    for (ii = 1, irow = 1; irow <= nrows; irow++) 
    {
        long elem;
        if (rowselect) {    /* if a row selector array is supplied... */

	  if (*rowselect) {
               rowselect++;   /* this row is included in the histogram */

	  } else {
               rowselect++;   /* this row is excluded from the histogram */

	       ii += histData->repeat; /* skip this portion of data */
               continue;
           }
        }


	/* Loop over elements in each row, increment ii after each element */

        for (elem = 1; elem <= histData->repeat; elem++, ii++) {
	  if (colptr[0][ii] == DOUBLENULLVALUE)  /* test for null value */
            continue;
	  if (colptr[4] && colptr[4][ii] == DOUBLENULLVALUE) /* and null weight */
	    continue;
	  
	  pix = (colptr[0][ii] - histData->amin1) / histData->binsize1;
	  ipix = (long) (pix + 1.); /* add 1 because the 1st pixel is the null value */
	  
	  /* test if bin is within range */
	  if (ipix < 1 || ipix > histData->haxis1 || pix > histData->maxbin1)
            continue;
	  
	  if (histData->haxis > 1)
	    {
	      if (colptr[1][ii] == DOUBLENULLVALUE)
		continue;
	      
	      axisbin = (colptr[1][ii] - histData->amin2) / histData->binsize2;
	      iaxisbin = (long) axisbin;
	      
	      if (axisbin < 0. || iaxisbin >= histData->haxis2 || axisbin > histData->maxbin2)
		continue;
	      
	      ipix += (iaxisbin * histData->incr[1]);
	      
	      if (histData->haxis > 2)
		{
		  if (colptr[2][ii] == DOUBLENULLVALUE)
		    continue;
		  
		  axisbin = (colptr[2][ii] - histData->amin3) / histData->binsize3;
		  iaxisbin = (long) axisbin;
		  if (axisbin < 0. || iaxisbin >= histData->haxis3 || axisbin > histData->maxbin3)
		    continue;
		  
		  ipix += (iaxisbin * histData->incr[2]);
		  
		  if (histData->haxis > 3)
		    {
		      if (colptr[3][ii] == DOUBLENULLVALUE)
			continue;
		      
		      axisbin = (colptr[3][ii] - histData->amin4) / histData->binsize4;
		      iaxisbin = (long) axisbin;
		      if (axisbin < 0. || iaxisbin >= histData->haxis4 || axisbin > histData->maxbin4)
			continue;
		      
		      ipix += (iaxisbin * histData->incr[3]);
		      
		    }  /* end of haxis > 3 case */
		}    /* end of haxis > 2 case */
	    }      /* end of haxis > 1 case */

	  /* increment the histogram pixel */
	  if (histData->weight != DOUBLENULLVALUE) /* constant weight factor */
	    {   /* Note that if wtrecip == 1, the reciprocal was precomputed above */
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) histData->weight;
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) histData->weight;
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += histData->weight;
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += histData->weight;
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) histData->weight;
	    }
	  else if (histData->wtrecip) /* use reciprocal of the weight */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) (1./colptr[4][ii]);
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) (1./colptr[4][ii]);
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += (float) (1./colptr[4][ii]);
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += 1./colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) (1./colptr[4][ii]);
	    }
	  else   /* no weights */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) colptr[4][ii];
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) colptr[4][ii];
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) colptr[4][ii];
	    }

	} /* end of loop over elements per row */

    }  /* end of main loop over all rows */

    histData->rowselector_cur = rowselect; /* Save row pointer for next go-round */
    return(status);
}